

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2cirs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  double jd;
  CESkyCoord cirs_coords;
  CESkyCoord icrs_coords;
  CEExecOptions opts;
  allocator local_3da;
  allocator local_3d9;
  string local_3d8;
  double local_3b8;
  CESkyCoordType local_3ac;
  CEAngle local_3a8 [48];
  string local_378 [2];
  double local_338;
  CESkyCoord local_330 [48];
  string local_300 [5];
  CEExecOptions local_250;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine(&local_250.super_CLOptions,argc,argv);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_300,"ra",&local_3d9);
    local_3b8 = CLOptions::AsDouble(&local_250.super_CLOptions,local_300);
    CEAngle::Deg((double *)local_3a8);
    std::__cxx11::string::string((string *)local_378,"dec",&local_3da);
    local_338 = CLOptions::AsDouble(&local_250.super_CLOptions,local_378);
    CEAngle::Deg((double *)&local_3d8);
    local_3ac = ICRS;
    CESkyCoord::CESkyCoord(local_330,local_3a8,(CEAngle *)&local_3d8,&local_3ac);
    CEAngle::~CEAngle((CEAngle *)&local_3d8);
    std::__cxx11::string::~string((string *)local_378);
    CEAngle::~CEAngle(local_3a8);
    std::__cxx11::string::~string((string *)local_300);
    std::__cxx11::string::string((string *)&local_3d8,"juliandate",(allocator *)&local_3b8);
    CLOptions::AsDouble(&local_250.super_CLOptions,&local_3d8);
    CEDate::CEDate((CEDate *)local_378,0);
    CEObserver::CEObserver((CEObserver *)local_300);
    CESkyCoord::ConvertToCIRS((CEDate *)local_3a8,(CEObserver *)local_330);
    CEObserver::~CEObserver((CEObserver *)local_300);
    CEDate::~CEDate((CEDate *)local_378);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::string((string *)local_300,"juliandate",(allocator *)local_378);
    jd = CLOptions::AsDouble(&local_250.super_CLOptions,local_300);
    PrintResults(local_330,(CESkyCoord *)local_3a8,jd);
    std::__cxx11::string::~string((string *)local_300);
    CESkyCoord::~CESkyCoord((CESkyCoord *)local_3a8);
    CESkyCoord::~CESkyCoord(local_330);
  }
  CEExecOptions::~CEExecOptions(&local_250);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
    // Get the options from the command line
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Create a CESkyCoord object
    CESkyCoord icrs_coords(CEAngle::Deg(opts.AsDouble("ra")), 
                           CEAngle::Deg(opts.AsDouble("dec")),
                           CESkyCoordType::ICRS);
    
    // Get the coordinates as CIRS
    CESkyCoord cirs_coords = icrs_coords.ConvertToCIRS(opts.AsDouble("juliandate"));
    
    // Print the result
    PrintResults(icrs_coords, cirs_coords, opts.AsDouble("juliandate")) ;

    return 0;
}